

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

void __thiscall
t_swift_generator::generate_swift_struct_init
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool all,bool is_private)

{
  t_type *ttype;
  t_struct *ptVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  ostream *poVar6;
  char *pcVar7;
  pointer pptVar8;
  undefined7 in_register_00000081;
  char *__s;
  string visibility;
  string local_c0;
  string local_a0;
  ostream *local_80;
  string local_78;
  t_struct *local_58;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  pcVar7 = "fileprivate";
  if ((this->gen_cocoa_ & 1U) != 0) {
    pcVar7 = "private";
  }
  __s = "public";
  if ((int)CONCAT71(in_register_00000081,is_private) != 0) {
    __s = pcVar7;
  }
  local_50 = local_40;
  sVar4 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,__s,__s + sVar4);
  local_80 = out;
  poVar5 = t_generator::indent((t_generator *)this,out);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_50,local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," init(",6);
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_58 = tstruct;
  if (pptVar8 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar3 = true;
    do {
      if (all) {
LAB_003567fa:
        if (bVar3) {
          bVar3 = false;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>(local_80,", ",2);
        }
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_80,((*pptVar8)->name_)._M_dataplus._M_p,
                            ((*pptVar8)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        ttype = (*pptVar8)->type_;
        bVar2 = field_is_optional(this,*pptVar8);
        type_name_abi_cxx11_(&local_a0,this,ttype,bVar2,false);
        maybe_escape_identifier(&local_c0,this,&local_a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
      else {
        bVar2 = field_is_optional(this,*pptVar8);
        if (!bVar2) goto LAB_003567fa;
      }
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             (local_58->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar5 = local_80;
  std::__ostream_insert<char,std::char_traits<char>>(local_80,")",1);
  block_open(this,poVar5);
  ptVar1 = local_58;
  pptVar8 = (local_58->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar8 !=
      (local_58->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (this->gen_cocoa_ == false) {
        if (!all) {
          bVar3 = field_is_optional(this,*pptVar8);
          if (bVar3) goto LAB_00356aef;
        }
        t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"self.",5);
        maybe_escape_identifier(&local_a0,this,&(*pptVar8)->name_);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        maybe_escape_identifier(&local_78,this,&(*pptVar8)->name_);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_78._M_dataplus._M_p,local_78._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_00356ab3:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
      }
      else if ((all) || (((*pptVar8)->req_ & ~T_OPT_IN_REQ_OUT) == T_REQUIRED)) {
        t_generator::indent_abi_cxx11_(&local_c0,(t_generator *)this);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"self.",5);
        maybe_escape_identifier(&local_a0,this,&(*pptVar8)->name_);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
        maybe_escape_identifier(&local_78,this,&(*pptVar8)->name_);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_78._M_dataplus._M_p,local_78._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        goto LAB_00356ab3;
      }
LAB_00356aef:
      pptVar8 = pptVar8 + 1;
    } while (pptVar8 !=
             (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  block_close(this,poVar5,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return;
}

Assistant:

void t_swift_generator::generate_swift_struct_init(ostream& out,
                                                   t_struct* tstruct,
                                                   bool all,
                                                   bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";

  indent(out) << visibility << " init(";

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  bool first=true;
  for (m_iter = members.begin(); m_iter != members.end();) {
    if (all || !field_is_optional(*m_iter)) {
      if (first) {
        first = false;
      }
      else {
        out << ", ";
      }
      out << (*m_iter)->get_name() << ": "
          << maybe_escape_identifier(type_name((*m_iter)->get_type(), field_is_optional(*m_iter)));
    }
    ++m_iter;
  }
  out << ")";

  block_open(out);

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if (!gen_cocoa_) {
      bool should_set = all;
      should_set = should_set || !field_is_optional((*m_iter));
      if (should_set) {
        out << indent() << "self." << maybe_escape_identifier((*m_iter)->get_name()) << " = "
            << maybe_escape_identifier((*m_iter)->get_name()) << endl;
      }
    } else {
      /** legacy Swift2/Cocoa */
      if (all || (*m_iter)->get_req() == t_field::T_REQUIRED || (*m_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        out << indent() << "self." << maybe_escape_identifier((*m_iter)->get_name()) << " = "
            << maybe_escape_identifier((*m_iter)->get_name()) << endl;
      }
    }
  }

  block_close(out);

  out << endl;
}